

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::Harness_Randomized_Test::TestBody(Harness_Randomized_Test *this)

{
  int iVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  Slice local_90;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string v;
  int e;
  int num_entries;
  Random rnd;
  int i;
  Harness_Randomized_Test *this_local;
  
  _rnd = this;
  for (num_entries = 0; num_entries < 0x10; num_entries = num_entries + 1) {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + (long)num_entries * 0xc));
    iVar1 = test::RandomSeed();
    Random::Random((Random *)&e,iVar1 + 5);
    for (v.field_2._12_4_ = 0; (int)v.field_2._12_4_ < 2000;
        v.field_2._12_4_ = iVar1 + v.field_2._12_4_) {
      uVar3 = 10;
      if ((int)v.field_2._12_4_ % 10 == 0) {
        uVar3 = 0x10;
        fprintf(_stderr,"case %d of %d: num_entries = %d\n",(ulong)(num_entries + 1),0x10,
                (ulong)(uint)v.field_2._12_4_);
      }
      for (v.field_2._8_4_ = 0; (int)v.field_2._8_4_ < (int)v.field_2._12_4_;
          v.field_2._8_4_ = v.field_2._8_4_ + 1) {
        std::__cxx11::string::string((string *)local_40);
        uVar2 = Random::Skewed((Random *)&e,4);
        test::RandomKey_abi_cxx11_(&local_60,(test *)&e,(Random *)(ulong)uVar2,(int)uVar3);
        uVar2 = Random::Skewed((Random *)&e,5);
        local_90 = test::RandomString((Random *)&e,uVar2,(string *)local_40);
        Slice::ToString_abi_cxx11_(&local_80,&local_90);
        Harness::Add(&this->super_Harness,&local_60,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)local_40);
      }
      Harness::Test(&this->super_Harness,(Random *)&e);
      iVar1 = 200;
      if ((int)v.field_2._12_4_ < 0x32) {
        iVar1 = 1;
      }
    }
  }
  return;
}

Assistant:

TEST_F(Harness, Randomized) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 5);
    for (int num_entries = 0; num_entries < 2000;
         num_entries += (num_entries < 50 ? 1 : 200)) {
      if ((num_entries % 10) == 0) {
        std::fprintf(stderr, "case %d of %d: num_entries = %d\n", (i + 1),
                     int(kNumTestArgs), num_entries);
      }
      for (int e = 0; e < num_entries; e++) {
        std::string v;
        Add(test::RandomKey(&rnd, rnd.Skewed(4)),
            test::RandomString(&rnd, rnd.Skewed(5), &v).ToString());
      }
      Test(&rnd);
    }
  }
}